

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O2

opj_jp2_v2_t * jp2_create(opj_bool p_is_decoder)

{
  opj_jp2_v2_t *jp2;
  opj_j2k_v2 *poVar1;
  opj_procedure_list_t *poVar2;
  
  jp2 = (opj_jp2_v2_t *)malloc(0x98);
  if (jp2 != (opj_jp2_v2_t *)0x0) {
    jp2->comps = (opj_jp2_comps_t *)0x0;
    jp2->j2k_codestream_offset = 0;
    jp2->jp2_state = 0;
    jp2->minversion = 0;
    jp2->numcl = 0;
    jp2->cl = (OPJ_UINT32 *)0x0;
    jp2->approx = 0;
    jp2->enumcs = 0;
    jp2->precedence = 0;
    jp2->brand = 0;
    jp2->C = 0;
    jp2->UnkC = 0;
    jp2->IPR = 0;
    jp2->meth = 0;
    jp2->w = 0;
    jp2->h = 0;
    jp2->numcomps = 0;
    jp2->bpc = 0;
    jp2->m_validation_list = (opj_procedure_list *)0x0;
    jp2->m_procedure_list = (opj_procedure_list *)0x0;
    if (p_is_decoder == 0) {
      poVar1 = j2k_create_compress_v2();
    }
    else {
      poVar1 = j2k_create_decompress_v2();
    }
    jp2->j2k = poVar1;
    if (poVar1 != (opj_j2k_v2 *)0x0) {
      (jp2->color).icc_profile_buf = (uchar *)0x0;
      (jp2->color).icc_profile_len = 0;
      (jp2->color).jp2_cdef = (opj_jp2_cdef_t *)0x0;
      (jp2->color).jp2_pclr = (opj_jp2_pclr_t *)0x0;
      (jp2->color).jp2_has_colr = '\0';
      poVar2 = opj_procedure_list_create();
      jp2->m_validation_list = poVar2;
      if (poVar2 != (opj_procedure_list_t *)0x0) {
        poVar2 = opj_procedure_list_create();
        jp2->m_procedure_list = poVar2;
        if (poVar2 != (opj_procedure_list_t *)0x0) {
          return jp2;
        }
      }
    }
    jp2_destroy(jp2);
  }
  return (opj_jp2_v2_t *)0x0;
}

Assistant:

opj_jp2_v2_t* jp2_create(opj_bool p_is_decoder)
{
	opj_jp2_v2_t *jp2 = (opj_jp2_v2_t*)opj_malloc(sizeof(opj_jp2_v2_t));
	if (jp2) {
		memset(jp2,0,sizeof(opj_jp2_t));

		/* create the J2K codec */
		if (! p_is_decoder) {
			jp2->j2k = j2k_create_compress_v2();
		}
		else {
			jp2->j2k = j2k_create_decompress_v2();
		}

		if (jp2->j2k == 00) {
			jp2_destroy(jp2);
			return 00;
		}

		/* Color structure */
		jp2->color.icc_profile_buf = NULL;
		jp2->color.icc_profile_len = 0;
		jp2->color.jp2_cdef = NULL;
		jp2->color.jp2_pclr = NULL;
		jp2->color.jp2_has_colr = 0;

		/* validation list creation */
		jp2->m_validation_list = opj_procedure_list_create();
		if (! jp2->m_validation_list) {
			jp2_destroy(jp2);
			return 00;
		}

		/* execution list creation */
		jp2->m_procedure_list = opj_procedure_list_create();
		if (! jp2->m_procedure_list) {
			jp2_destroy(jp2);
			return 00;
		}
	}

	return jp2;
}